

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_verify.c
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  yajl_status yVar3;
  int iVar4;
  yajl_handle h;
  size_t sVar5;
  uint uVar6;
  char *pcVar7;
  ulong uVar8;
  ulong uVar9;
  yajl_option opt;
  
  h = yajl_alloc((yajl_callbacks *)0x0,(yajl_alloc_funcs *)0x0,(void *)0x0);
  bVar1 = true;
  if (1 < argc) {
    uVar9 = 1;
    bVar1 = false;
    do {
      if ((*argv[uVar9] != '-') || (sVar5 = strlen(argv[uVar9]), sVar5 < 2)) {
LAB_001024ed:
        main_cold_1();
      }
      pcVar7 = argv[uVar9];
      sVar5 = strlen(pcVar7);
      if (1 < sVar5) {
        uVar8 = 1;
        uVar6 = 2;
        bVar2 = bVar1;
        do {
          opt = yajl_allow_comments;
          bVar1 = true;
          switch((int)pcVar7[uVar8] - 99U >> 1 | (uint)(((int)pcVar7[uVar8] - 99U & 1) != 0) << 0x1f
                ) {
          case 0:
            break;
          default:
            main_cold_4();
            goto LAB_001024ed;
          case 7:
            goto switchD_001023aa_caseD_7;
          case 8:
            opt = yajl_allow_multiple_values;
            break;
          case 9:
            opt = yajl_dont_validate_strings;
          }
          yajl_config(h,opt,1);
          bVar1 = bVar2;
switchD_001023aa_caseD_7:
          uVar8 = (ulong)uVar6;
          pcVar7 = argv[uVar9];
          sVar5 = strlen(pcVar7);
          uVar6 = uVar6 + 1;
          bVar2 = bVar1;
        } while (uVar8 < sVar5);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != (uint)argc);
    bVar1 = !bVar1;
  }
  do {
    sVar5 = fread(main::fileData,1,0xffff,_stdin);
    if (sVar5 == 0) {
      iVar4 = feof(_stdin);
      if ((bool)(iVar4 == 0 & bVar1)) {
        main_cold_2();
        uVar6 = 1;
      }
      else {
        uVar6 = (uint)(iVar4 == 0);
      }
      goto LAB_0010246a;
    }
    main::fileData[sVar5] = '\0';
    yVar3 = yajl_parse(h,main::fileData,sVar5);
  } while (yVar3 == yajl_status_ok);
  uVar6 = 0;
LAB_0010246a:
  yVar3 = yajl_complete_parse(h);
  if (yVar3 != yajl_status_ok) {
    uVar6 = 1;
  }
  if ((bool)(yVar3 != yajl_status_ok & bVar1)) {
    main_cold_3();
    uVar6 = 1;
  }
  yajl_free(h);
  if (bVar1) {
    pcVar7 = "invalid";
    if (uVar6 == 0) {
      pcVar7 = "valid";
    }
    printf("JSON is %s\n",pcVar7);
  }
  return uVar6;
}

Assistant:

int
main(int argc, char ** argv)
{
    yajl_status stat;
    size_t rd;
    yajl_handle hand;
    static unsigned char fileData[65536];
    int quiet = 0;
    int retval = 0;
    int a = 1;

    /* allocate a parser */
    hand = yajl_alloc(NULL, NULL, NULL);

    /* check arguments.*/
    while ((a < argc) && (argv[a][0] == '-') && (strlen(argv[a]) > 1)) {
        unsigned int i;
        for ( i=1; i < strlen(argv[a]); i++) {
            switch (argv[a][i]) {
                case 'q':
                    quiet = 1;
                    break;
                case 'c':
                    yajl_config(hand, yajl_allow_comments, 1);
                    break;
                case 'u':
                    yajl_config(hand, yajl_dont_validate_strings, 1);
                    break;
                case 's':
                    yajl_config(hand, yajl_allow_multiple_values, 1);
                    break;
                default:
                    fprintf(stderr, "unrecognized option: '%c'\n\n", argv[a][i]);
                    usage(argv[0]);
            }
        }
        ++a;
    }
    if (a < argc) {
        usage(argv[0]);
    }

    for (;;) {
        rd = fread((void *) fileData, 1, sizeof(fileData) - 1, stdin);

        retval = 0;

        if (rd == 0) {
            if (!feof(stdin)) {
                if (!quiet) {
                    fprintf(stderr, "error encountered on file read\n");
                }
                retval = 1;
            }
            break;
        }
        fileData[rd] = 0;

        /* read file data, pass to parser */
        stat = yajl_parse(hand, fileData, rd);

        if (stat != yajl_status_ok) break;
    }

    /* parse any remaining buffered data */
    stat = yajl_complete_parse(hand);

    if (stat != yajl_status_ok)
    {
        if (!quiet) {
            unsigned char * str = yajl_get_error(hand, 1, fileData, rd);
            fprintf(stderr, "%s", (const char *) str);
            yajl_free_error(hand, str);
        }
        retval = 1;
    }

    yajl_free(hand);

    if (!quiet) {
        printf("JSON is %s\n", retval ? "invalid" : "valid");
    }

    return retval;
}